

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage11_avx2(__m256i *u,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo,
                        __m256i *clamp_hi)

{
  undefined1 auVar1 [16];
  __m256i in1;
  __m256i in0;
  int in_ECX;
  uint uVar2;
  int in_EDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  int i;
  int in_stack_fffffffffffffea4;
  __m256i *in_stack_fffffffffffffea8;
  undefined1 local_144;
  __m256i *in_stack_fffffffffffffed8;
  __m256i *in_stack_fffffffffffffee0;
  __m256i *in_stack_fffffffffffffee8;
  __m256i *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar3;
  undefined4 uVar4;
  int size;
  undefined4 in_stack_ffffffffffffff18;
  
  uVar4 = (undefined4)in_R9;
  size = (int)((ulong)in_R9 >> 0x20);
  for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
    in0[0]._4_4_ = in_R8D;
    in0[0]._0_4_ = in_stack_ffffffffffffff18;
    in0[1]._0_4_ = in_ECX;
    in0[1]._4_4_ = in_EDX;
    in0[2] = (longlong)in_RSI;
    in0[3] = (longlong)in_RDI;
    in1[1] = in_stack_ffffffffffffff00;
    in1[0] = in_stack_fffffffffffffef8;
    in1[2]._0_4_ = in_stack_ffffffffffffff08;
    in1[2]._4_4_ = iVar3;
    in1[3]._0_4_ = uVar4;
    in1[3]._4_4_ = size;
    addsub_avx2(in0,in1,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if (in_EDX == 0) {
    if (in_ECX + 6 < 0x10) {
      local_144 = '\x10';
    }
    else {
      local_144 = (char)in_ECX + '\x06';
    }
    uVar2 = -(1 << (local_144 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    uVar2 = (1 << (local_144 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
    auVar1 = vpinsrd_avx(auVar1,uVar2,2);
    vpinsrd_avx(auVar1,uVar2,3);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    round_shift_8x8_avx2(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    highbd_clamp_epi32_avx2
              (in_RDI,in_RSI,(__m256i *)CONCAT44(in_EDX,in_ECX),
               (__m256i *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),size);
  }
  return;
}

Assistant:

static inline void idct64_stage11_avx2(__m256i *u, __m256i *out, int do_cols,
                                       int bd, int out_shift,
                                       const __m256i *clamp_lo,
                                       const __m256i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_avx2(u[i], u[63 - i], &out[(i)], &out[(63 - i)], clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    round_shift_8x8_avx2(out + 32, out_shift);
    round_shift_8x8_avx2(out + 48, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 64);
  }
}